

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.c
# Opt level: O0

void uv__io_stop(uv_loop_t *loop,uv__io_t *w,uint events)

{
  uint in_EDX;
  long in_RSI;
  long in_RDI;
  
  if ((in_EDX & 0xfffffffa) != 0) {
    __assert_fail("0 == (events & ~(UV__POLLIN | UV__POLLOUT))","src/unix/core.c",0x2dc,
                  "void uv__io_stop(uv_loop_t *, uv__io_t *, unsigned int)");
  }
  if (in_EDX == 0) {
    __assert_fail("0 != events","src/unix/core.c",0x2dd,
                  "void uv__io_stop(uv_loop_t *, uv__io_t *, unsigned int)");
  }
  if (*(int *)(in_RSI + 0x30) != -1) {
    if (*(int *)(in_RSI + 0x30) < 0) {
      __assert_fail("w->fd >= 0","src/unix/core.c",0x2e2,
                    "void uv__io_stop(uv_loop_t *, uv__io_t *, unsigned int)");
    }
    if (*(uint *)(in_RSI + 0x30) < *(uint *)(in_RDI + 0x70)) {
      *(uint *)(in_RSI + 0x28) = (in_EDX ^ 0xffffffff) & *(uint *)(in_RSI + 0x28);
      if (*(int *)(in_RSI + 0x28) == 0) {
        **(undefined8 **)(in_RSI + 0x20) = *(undefined8 *)(in_RSI + 0x18);
        *(undefined8 *)(*(long *)(in_RSI + 0x18) + 8) = *(undefined8 *)(in_RSI + 0x20);
        *(long *)(in_RSI + 0x18) = in_RSI + 0x18;
        *(long *)(in_RSI + 0x20) = in_RSI + 0x18;
        if (*(long *)(*(long *)(in_RDI + 0x68) + (long)*(int *)(in_RSI + 0x30) * 8) != 0) {
          if (*(long *)(*(long *)(in_RDI + 0x68) + (long)*(int *)(in_RSI + 0x30) * 8) != in_RSI) {
            __assert_fail("loop->watchers[w->fd] == w","src/unix/core.c",0x2ef,
                          "void uv__io_stop(uv_loop_t *, uv__io_t *, unsigned int)");
          }
          if (*(int *)(in_RDI + 0x74) == 0) {
            __assert_fail("loop->nfds > 0","src/unix/core.c",0x2f0,
                          "void uv__io_stop(uv_loop_t *, uv__io_t *, unsigned int)");
          }
          *(undefined8 *)(*(long *)(in_RDI + 0x68) + (long)*(int *)(in_RSI + 0x30) * 8) = 0;
          *(int *)(in_RDI + 0x74) = *(int *)(in_RDI + 0x74) + -1;
          *(undefined4 *)(in_RSI + 0x2c) = 0;
        }
      }
      else if (in_RSI + 0x18 == *(long *)(in_RSI + 0x18)) {
        *(long *)(in_RSI + 0x18) = in_RDI + 0x58;
        *(undefined8 *)(in_RSI + 0x20) = *(undefined8 *)(in_RDI + 0x60);
        **(long **)(in_RSI + 0x20) = in_RSI + 0x18;
        *(long *)(in_RDI + 0x60) = in_RSI + 0x18;
      }
    }
  }
  return;
}

Assistant:

void uv__io_stop(uv_loop_t* loop, uv__io_t* w, unsigned int events) {
  assert(0 == (events & ~(UV__POLLIN | UV__POLLOUT)));
  assert(0 != events);

  if (w->fd == -1)
    return;

  assert(w->fd >= 0);

  /* Happens when uv__io_stop() is called on a handle that was never started. */
  if ((unsigned) w->fd >= loop->nwatchers)
    return;

  w->pevents &= ~events;

  if (w->pevents == 0) {
    QUEUE_REMOVE(&w->watcher_queue);
    QUEUE_INIT(&w->watcher_queue);

    if (loop->watchers[w->fd] != NULL) {
      assert(loop->watchers[w->fd] == w);
      assert(loop->nfds > 0);
      loop->watchers[w->fd] = NULL;
      loop->nfds--;
      w->events = 0;
    }
  }
  else if (QUEUE_EMPTY(&w->watcher_queue))
    QUEUE_INSERT_TAIL(&loop->watcher_queue, &w->watcher_queue);
}